

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O1

bool __thiscall spvtools::opt::LoopFusion::AreCompatible(LoopFusion *this)

{
  Op OVar1;
  IRContext *pIVar2;
  CFG *pCVar3;
  Function *pFVar4;
  BasicBlock *pBVar5;
  DefUseManager *pDVar6;
  bool bVar7;
  uint32_t uVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar9;
  Instruction *this_00;
  pointer ppBVar10;
  uint uVar11;
  Instruction *inst;
  Instruction *pIVar12;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> UVar13;
  value_type *block;
  vector<unsigned_int,_std::allocator<unsigned_int>_> preds;
  BasicBlock *pre_header_1;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_c0;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> local_98;
  pointer local_80;
  pointer local_78;
  BasicBlock *local_70;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_68;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_48;
  
  if (((this->loop_0_->loop_header_->function_ != this->loop_1_->loop_header_->function_) ||
      (this->loop_0_->loop_preheader_ == (BasicBlock *)0x0)) ||
     (this->loop_1_->loop_preheader_ == (BasicBlock *)0x0)) {
    return false;
  }
  pIVar2 = this->context_;
  if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar2);
  }
  pCVar3 = (pIVar2->cfg_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
           super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  pIVar12 = (this->loop_0_->loop_merge_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar8 = 0;
  if (pIVar12->has_result_id_ == true) {
    uVar8 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
  }
  pvVar9 = CFG::preds(pCVar3,uVar8);
  if ((long)(pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start != 4) {
    return false;
  }
  pIVar2 = this->context_;
  if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar2);
  }
  pCVar3 = (pIVar2->cfg_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
           super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  pIVar12 = (this->loop_1_->loop_merge_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar8 = 0;
  if (pIVar12->has_result_id_ == true) {
    uVar8 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
  }
  pvVar9 = CFG::preds(pCVar3,uVar8);
  if ((long)(pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start != 4) {
    return false;
  }
  pIVar2 = this->context_;
  if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar2);
  }
  pCVar3 = (pIVar2->cfg_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
           super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  pIVar12 = (this->loop_0_->loop_continue_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar8 = 0;
  if (pIVar12->has_result_id_ == true) {
    uVar8 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
  }
  pvVar9 = CFG::preds(pCVar3,uVar8);
  if ((long)(pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start != 4) {
    return false;
  }
  pIVar2 = this->context_;
  if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar2);
  }
  pCVar3 = (pIVar2->cfg_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
           super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  pIVar12 = (this->loop_1_->loop_continue_->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar8 = 0;
  if (pIVar12->has_result_id_ == true) {
    uVar8 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
  }
  pvVar9 = CFG::preds(pCVar3,uVar8);
  if ((long)(pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start != 4) {
    return false;
  }
  local_48.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar7 = false;
  local_48.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Loop::GetInductionVariables(this->loop_0_,&local_48);
  RemoveIfNotUsedContinueOrConditionBlock(this,&local_48,this->loop_0_);
  if ((long)local_48.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_48.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start != 8) goto LAB_0027d60d;
  this->induction_0_ =
       *local_48.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_start;
  Loop::GetInductionVariables(this->loop_1_,&local_68);
  RemoveIfNotUsedContinueOrConditionBlock(this,&local_68,this->loop_1_);
  if ((long)local_68.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_68.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start == 8) {
    this->induction_1_ =
         *local_68.
          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_start;
    bVar7 = CheckInit(this);
    if (((bVar7) && (bVar7 = CheckCondition(this), bVar7)) && (bVar7 = CheckStep(this), bVar7)) {
      local_70 = this->loop_1_->loop_preheader_;
      local_98.
      super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.
      super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.
      super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
      push_back(&local_98,&local_70);
      if (this->loop_0_->loop_merge_ == this->loop_1_->loop_preheader_) {
LAB_0027d670:
        local_80 = local_98.
                   super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        bVar7 = local_98.
                super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_98.
                super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
        if (!bVar7) {
          ppBVar10 = local_98.
                     super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          do {
            pBVar5 = *ppBVar10;
            local_78 = ppBVar10;
            for (pIVar12 = (pBVar5->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
                           sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
                pIVar12 !=
                &(pBVar5->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
                pIVar12 = (pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_)
            {
              OVar1 = pIVar12->opcode_;
              if (OVar1 != OpBranch) {
                if (OVar1 == OpPhi) {
                  uVar11 = (pIVar12->has_result_id_ & 1) + 1;
                  if (pIVar12->has_type_id_ == false) {
                    uVar11 = (uint)pIVar12->has_result_id_;
                  }
                  if ((int)((ulong)((long)(pIVar12->operands_).
                                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pIVar12->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                      -0x55555555 - uVar11 != 2) goto LAB_0027d827;
                }
                else {
                  if (OVar1 != OpStore) goto LAB_0027d827;
                  pIVar2 = this->context_;
                  if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
                    IRContext::BuildDefUseManager(pIVar2);
                  }
                  pDVar6 = (pIVar2->def_use_mgr_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                           _M_head_impl;
                  uVar8 = (pIVar12->has_result_id_ & 1) + 1;
                  if (pIVar12->has_type_id_ == false) {
                    uVar8 = (uint)pIVar12->has_result_id_;
                  }
                  uVar8 = Instruction::GetSingleWordOperand(pIVar12,uVar8);
                  this_00 = analysis::DefUseManager::GetDef(pDVar6,uVar8);
                  if (this_00->opcode_ != OpVariable) goto LAB_0027d827;
                  uVar8 = (this_00->has_result_id_ & 1) + 1;
                  if (this_00->has_type_id_ == false) {
                    uVar8 = (uint)this_00->has_result_id_;
                  }
                  uVar8 = Instruction::GetSingleWordOperand(this_00,uVar8);
                  if (uVar8 != 7) goto LAB_0027d827;
                  local_c0._M_head_impl = local_c0._M_head_impl & 0xffffffffffffff00;
                  pIVar2 = this->context_;
                  if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
                    IRContext::BuildDefUseManager(pIVar2);
                  }
                  pDVar6 = (pIVar2->def_use_mgr_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                           _M_head_impl;
                  uVar8 = (pIVar12->has_result_id_ & 1) + 1;
                  if (pIVar12->has_type_id_ == false) {
                    uVar8 = (uint)pIVar12->has_result_id_;
                  }
                  uVar8 = Instruction::GetSingleWordOperand(pIVar12,uVar8);
                  local_b8._8_8_ = 0;
                  local_b8._M_unused._M_object = &local_c0;
                  pcStack_a0 = std::
                               _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fusion.cpp:211:13)>
                               ::_M_invoke;
                  local_a8 = std::
                             _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fusion.cpp:211:13)>
                             ::_M_manager;
                  analysis::DefUseManager::ForEachUse
                            (pDVar6,uVar8,
                             (function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)
                             &local_b8);
                  if (local_a8 != (code *)0x0) {
                    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
                  }
                  if ((char)local_c0._M_head_impl != '\0') goto LAB_0027d827;
                }
              }
            }
            ppBVar10 = local_78 + 1;
            bVar7 = ppBVar10 == local_80;
          } while (!bVar7);
        }
      }
      else {
        pIVar2 = this->context_;
        if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
          IRContext::BuildCFG(pIVar2);
        }
        pCVar3 = (pIVar2->cfg_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                 .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
        pIVar12 = (local_70->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar8 = 0;
        if (pIVar12->has_result_id_ == true) {
          uVar8 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
        }
        pvVar9 = CFG::preds(pCVar3,uVar8);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b8,pvVar9);
        if (local_b8._8_8_ - local_b8._0_8_ == 4) {
          pFVar4 = this->containing_function_;
          UVar13 = std::
                   __find_if<spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,false>,__gnu_cxx::__ops::_Iter_pred<spvtools::opt::Function::FindBlock(unsigned_int)::_lambda(spvtools::opt::BasicBlock_const&)_1_>>
                             (&pFVar4->blocks_,
                              (pFVar4->blocks_).
                              super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,&pFVar4->blocks_,
                              (pFVar4->blocks_).
                              super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,
                              *local_b8._M_unused._M_object);
          local_c0._M_head_impl =
               ((UVar13.iterator_._M_current._M_current)->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
          if (local_c0._M_head_impl == this->loop_0_->loop_merge_) {
            std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
            push_back(&local_98,&local_c0._M_head_impl);
            if ((_Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> *)local_b8._M_unused._0_8_ !=
                (_Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> *)0x0) {
              operator_delete(local_b8._M_unused._M_object,(long)local_a8 - local_b8._0_8_);
            }
            goto LAB_0027d670;
          }
        }
        if ((_Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> *)local_b8._M_unused._0_8_ !=
            (_Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> *)0x0) {
          operator_delete(local_b8._M_unused._M_object,(long)local_a8 - local_b8._0_8_);
        }
        bVar7 = false;
      }
LAB_0027d827:
      if (local_98.
          super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.
                        super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_98.
                              super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.
                              super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_0027d60d;
    }
  }
  bVar7 = false;
LAB_0027d60d:
  if (local_68.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    return bVar7;
  }
  return bVar7;
}

Assistant:

bool LoopFusion::AreCompatible() {
  // Check that the loops are in the same function.
  if (loop_0_->GetHeaderBlock()->GetParent() !=
      loop_1_->GetHeaderBlock()->GetParent()) {
    return false;
  }

  // Check that both loops have pre-header blocks.
  if (!loop_0_->GetPreHeaderBlock() || !loop_1_->GetPreHeaderBlock()) {
    return false;
  }

  // Check there are no breaks.
  if (context_->cfg()->preds(loop_0_->GetMergeBlock()->id()).size() != 1 ||
      context_->cfg()->preds(loop_1_->GetMergeBlock()->id()).size() != 1) {
    return false;
  }

  // Check there are no continues.
  if (context_->cfg()->preds(loop_0_->GetContinueBlock()->id()).size() != 1 ||
      context_->cfg()->preds(loop_1_->GetContinueBlock()->id()).size() != 1) {
    return false;
  }

  // |GetInductionVariables| returns all OpPhi in the header. Check that both
  // loops have exactly one that is used in the continue and condition blocks.
  std::vector<Instruction*> inductions_0{}, inductions_1{};
  loop_0_->GetInductionVariables(inductions_0);
  RemoveIfNotUsedContinueOrConditionBlock(&inductions_0, loop_0_);

  if (inductions_0.size() != 1) {
    return false;
  }

  induction_0_ = inductions_0.front();

  loop_1_->GetInductionVariables(inductions_1);
  RemoveIfNotUsedContinueOrConditionBlock(&inductions_1, loop_1_);

  if (inductions_1.size() != 1) {
    return false;
  }

  induction_1_ = inductions_1.front();

  if (!CheckInit()) {
    return false;
  }

  if (!CheckCondition()) {
    return false;
  }

  if (!CheckStep()) {
    return false;
  }

  // Check adjacency, |loop_0_| should come just before |loop_1_|.
  // There is always at least one block between loops, even if it's empty.
  // We'll check at most 2 preceding blocks.

  auto pre_header_1 = loop_1_->GetPreHeaderBlock();

  std::vector<BasicBlock*> block_to_check{};
  block_to_check.push_back(pre_header_1);

  if (loop_0_->GetMergeBlock() != loop_1_->GetPreHeaderBlock()) {
    // Follow CFG for one more block.
    auto preds = context_->cfg()->preds(pre_header_1->id());
    if (preds.size() == 1) {
      auto block = &*containing_function_->FindBlock(preds.front());
      if (block == loop_0_->GetMergeBlock()) {
        block_to_check.push_back(block);
      } else {
        return false;
      }
    } else {
      return false;
    }
  }

  // Check that the separating blocks are either empty or only contains a store
  // to a local variable that is never read (left behind by
  // '--eliminate-local-multi-store'). Also allow OpPhi, since the loop could be
  // in LCSSA form.
  for (auto block : block_to_check) {
    for (auto& inst : *block) {
      if (inst.opcode() == spv::Op::OpStore) {
        // Get the definition of the target to check it's function scope so
        // there are no observable side effects.
        auto variable =
            context_->get_def_use_mgr()->GetDef(inst.GetSingleWordInOperand(0));

        if (variable->opcode() != spv::Op::OpVariable ||
            spv::StorageClass(variable->GetSingleWordInOperand(0)) !=
                spv::StorageClass::Function) {
          return false;
        }

        // Check the target is never loaded.
        auto is_used = false;
        context_->get_def_use_mgr()->ForEachUse(
            inst.GetSingleWordInOperand(0),
            [&is_used](Instruction* use_inst, uint32_t) {
              if (use_inst->opcode() == spv::Op::OpLoad) {
                is_used = true;
              }
            });

        if (is_used) {
          return false;
        }
      } else if (inst.opcode() == spv::Op::OpPhi) {
        if (inst.NumInOperands() != 2) {
          return false;
        }
      } else if (inst.opcode() != spv::Op::OpBranch) {
        return false;
      }
    }
  }

  return true;
}